

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard-graphics.cpp
# Opt level: O2

string * __thiscall
Game::Gameboard::Graphics::GameBoardTextOutput_abi_cxx11_
          (string *__return_storage_ptr__,Graphics *this,GameBoard *gb)

{
  size_t sVar1;
  long lVar2;
  ostream *poVar3;
  undefined1 *puVar4;
  point2D_t *pt;
  pointer ptVar5;
  char *pcVar6;
  int i;
  int iVar7;
  string *this_00;
  pointer ptVar8;
  ulong uVar9;
  tile_t tVar10;
  tile_t currentTile;
  pointer local_338;
  undefined1 local_310 [32];
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
  local_2c8;
  _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
  local_2a8;
  gameboard_data_array_t local_288;
  undefined1 local_268 [80];
  undefined8 auStack_218 [2];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  vertibar;
  ostringstream str_os;
  
  std::_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>::
  _Tuple_impl(&local_2c8,
              (_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
               *)this);
  std::_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>::
  _Tuple_impl(&local_2a8,&local_2c8);
  sVar1 = getPlaySizeOfGameboardDataArray((gameboard_data_array_t *)&local_2a8);
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
            ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_2a8);
  lVar2 = 0x10;
  do {
    puVar4 = (undefined1 *)((long)&vertibar._M_elems[0]._M_dataplus._M_p + lVar2);
    *(undefined1 **)((long)auStack_218 + lVar2) = puVar4;
    *(undefined8 *)((long)auStack_218 + lVar2 + 8) = 0;
    *puVar4 = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x70);
  local_310._0_8_ = anon_var_dwarf_28468 + 0x54;
  local_310._8_8_ = anon_var_dwarf_f7e3;
  local_310._16_8_ = anon_var_dwarf_f7cd;
  local_310._24_8_ = (long)anon_var_dwarf_64429 + 0xf9;
  local_2f0 = anon_var_dwarf_f801;
  local_2e8 = anon_var_dwarf_f7f7;
  local_2e0 = anon_var_dwarf_2847e + 0x54;
  local_2d8 = anon_var_dwarf_f81f;
  local_2d0 = anon_var_dwarf_f815;
  lVar2 = 0;
  ptVar8 = (pointer)0x0;
  if (0 < (int)sVar1) {
    ptVar8 = (pointer)(sVar1 & 0xffffffff);
  }
  this_00 = (string *)&vertibar;
  for (; lVar2 != 0x48; lVar2 = lVar2 + 0x18) {
    std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<char_const*,char_const*,char_const*>
              ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)
               local_268,
               (_Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*> *)(local_310 + lVar2));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str_os);
    poVar3 = std::operator<<((ostream *)&str_os,"  ");
    std::operator<<(poVar3,(string *)(local_268 + 0x40));
    for (iVar7 = 0; (int)ptVar8 != iVar7; iVar7 = iVar7 + 1) {
      poVar3 = std::operator<<((ostream *)&str_os,anon_var_dwarf_64453 + 0xc);
      puVar4 = (undefined1 *)((ulong)(iVar7 < (int)sVar1 + -1) * 0x20);
      std::operator<<(poVar3,(string *)(local_268 + (long)puVar4));
    }
    std::operator<<((ostream *)&str_os,"\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str_os);
    std::__cxx11::string::operator=(this_00,(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_268);
    this_00 = this_00 + 0x20;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str_os);
  for (ptVar5 = (pointer)0x0; ptVar5 != ptVar8; ptVar5 = (pointer)((long)&ptVar5->value + 1)) {
    std::operator<<((ostream *)&str_os,(string *)(vertibar._M_elems + (ptVar5 != (pointer)0x0)));
    local_338 = ptVar5;
    for (uVar9 = 0; (sVar1 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
      pcVar6 = " ";
      if (uVar9 == 0) {
        pcVar6 = "  ";
      }
      std::
      _Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>::
      _Tuple_impl((_Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
                   *)local_268,&local_2c8);
      local_288.
      super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
      .super__Tuple_impl<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>.
      super__Head_base<1UL,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>,_false>.
      _M_head_impl.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
      super__Vector_impl_data._M_start = local_338;
      tVar10 = getTileOnGameboardDataArray((Game *)local_268,&local_288,pt);
      std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
                ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)local_268);
      std::operator<<((ostream *)&str_os,pcVar6);
      std::operator<<((ostream *)&str_os,anon_var_dwarf_6451b + 2);
      currentTile.value = (ulong)(tVar10._8_4_ & 0xff);
      currentTile._8_8_ = puVar4;
      drawTileString_abi_cxx11_((string *)local_310,(Game *)tVar10.value,currentTile);
      std::operator<<((ostream *)&str_os,(string *)local_310);
      std::__cxx11::string::~string((string *)local_310);
      local_338 = local_338 + 0x10000000;
    }
    std::operator<<((ostream *)&str_os,anon_var_dwarf_f7b9);
    std::operator<<((ostream *)&str_os,"\n");
  }
  std::operator<<((ostream *)&str_os,(string *)(vertibar._M_elems + 2));
  std::operator<<((ostream *)&str_os,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str_os);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
  ~array(&vertibar);
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
            ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_2c8);
  return __return_storage_ptr__;
}

Assistant:

std::string GameBoardTextOutput(GameBoard gb) {
  return drawSelf(gb.gbda);
}